

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

Col_Word NewMConcatList(Col_Word left,Col_Word right)

{
  byte bVar1;
  size_t sVar2;
  Cell *pacVar3;
  size_t local_50;
  byte local_48;
  Col_Word mconcatNode;
  size_t rightLength;
  size_t leftLength;
  size_t rightDepth;
  size_t leftDepth;
  Col_Word right_local;
  Col_Word left_local;
  
  bVar1 = GetDepth(left);
  local_48 = GetDepth(right);
  local_50 = Col_ListLength(left);
  sVar2 = Col_ListLength(right);
  pacVar3 = AllocCells(1);
  (*pacVar3)[0] = '&';
  if (local_48 < bVar1) {
    local_48 = bVar1;
  }
  (*pacVar3)[1] = local_48 + 1;
  *(size_t *)(*pacVar3 + 8) = local_50 + sVar2;
  if (0xffff < local_50) {
    local_50 = 0;
  }
  *(short *)(*pacVar3 + 2) = (short)local_50;
  *(Col_Word *)(*pacVar3 + 0x10) = left;
  *(Col_Word *)(*pacVar3 + 0x18) = right;
  return (Col_Word)pacVar3;
}

Assistant:

static Col_Word
NewMConcatList(
    Col_Word left,  /*!< Left part. */
    Col_Word right) /*!< Right part. */
{
    size_t leftDepth = GetDepth(left), rightDepth = GetDepth(right);
    size_t leftLength = Col_ListLength(left),
            rightLength = Col_ListLength(right);
    Col_Word mconcatNode = (Col_Word) AllocCells(1);
    WORD_MCONCATLIST_INIT(mconcatNode,
            (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
            leftLength + rightLength, leftLength, left, right);
    return mconcatNode;
}